

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O0

TIfStackEntry __thiscall tcpp::Preprocessor::_processIfndefConditional(Preprocessor *this)

{
  bool shouldBeSkipped;
  bool isParentBlockActive;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  local_120;
  string *local_118;
  TMacroDesc *local_110;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  local_108;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  local_100;
  undefined1 local_f5;
  E_TOKEN_TYPE local_f4;
  undefined1 local_f0 [3];
  bool skip;
  string local_b8 [8];
  string macroIdentifier;
  TToken local_90;
  E_TOKEN_TYPE local_54;
  undefined1 local_50 [8];
  TToken currToken;
  Preprocessor *this_local;
  
  currToken.mPos = (size_t)this;
  Lexer::GetNextToken((TToken *)local_50,this->mpLexer);
  local_54 = SPACE;
  _expect(this,&local_54,(E_TOKEN_TYPE *)local_50);
  Lexer::GetNextToken(&local_90,this->mpLexer);
  TToken::operator=((TToken *)local_50,&local_90);
  TToken::~TToken(&local_90);
  macroIdentifier.field_2._12_4_ = 0;
  _expect(this,(E_TOKEN_TYPE *)(macroIdentifier.field_2._M_local_buf + 0xc),(E_TOKEN_TYPE *)local_50
         );
  std::__cxx11::string::string(local_b8,(string *)&currToken);
  do {
    Lexer::GetNextToken((TToken *)local_f0,this->mpLexer);
    TToken::operator=((TToken *)local_50,(TToken *)local_f0);
    TToken::~TToken((TToken *)local_f0);
  } while (local_50._0_4_ == SPACE);
  local_f4 = NEWLINE;
  _expect(this,&local_f4,(E_TOKEN_TYPE *)local_50);
  local_108._M_current =
       (TMacroDesc *)
       std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>::cbegin
                 ((vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_> *)&this->mSymTable);
  local_110 = (TMacroDesc *)
              std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>::cend
                        ((vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_> *)
                         &this->mSymTable);
  local_118 = (string *)local_b8;
  local_100 = std::
              find_if<__gnu_cxx::__normal_iterator<tcpp::TMacroDesc_const*,std::vector<tcpp::TMacroDesc,std::allocator<tcpp::TMacroDesc>>>,tcpp::Preprocessor::_processIfndefConditional()::__0>
                        (local_108,
                         (__normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
                          )local_110,(anon_class_8_1_d560b775_for__M_pred)local_118);
  local_120._M_current =
       (TMacroDesc *)
       std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>::cend
                 ((vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_> *)&this->mSymTable);
  shouldBeSkipped = __gnu_cxx::operator!=(&local_100,&local_120);
  local_f5 = shouldBeSkipped;
  isParentBlockActive = IsParentBlockActive(&this->mConditionalBlocksStack);
  TIfStackEntry::TIfStackEntry
            ((TIfStackEntry *)((long)&this_local + 4),shouldBeSkipped,isParentBlockActive);
  std::__cxx11::string::~string(local_b8);
  TToken::~TToken((TToken *)local_50);
  return this_local._4_4_;
}

Assistant:

Preprocessor::TIfStackEntry Preprocessor::_processIfndefConditional() TCPP_NOEXCEPT
	{
		auto currToken = mpLexer->GetNextToken();
		_expect(E_TOKEN_TYPE::SPACE, currToken.mType);

		currToken = mpLexer->GetNextToken();
		_expect(E_TOKEN_TYPE::IDENTIFIER, currToken.mType);

		std::string macroIdentifier = currToken.mRawView;

		do {
			currToken = mpLexer->GetNextToken();
		} while (currToken.mType == E_TOKEN_TYPE::SPACE);

		_expect(E_TOKEN_TYPE::NEWLINE, currToken.mType);

		bool skip = std::find_if(mSymTable.cbegin(), mSymTable.cend(), [&macroIdentifier](auto&& item)
			{
				return item.mName == macroIdentifier;
			}) != mSymTable.cend();

		// \note IsParentBlockActive is used to inherit disabled state for nested blocks
		return TIfStackEntry(skip, IsParentBlockActive(mConditionalBlocksStack));
	}